

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O3

void __thiscall
NativeCodeGenerator::AllocateBackgroundCodeGenProfiler
          (NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  bool bVar1;
  ScriptContextProfiler *this_00;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar1) {
    this_00 = (ScriptContextProfiler *)
              Memory::NoCheckHeapAllocator::Alloc
                        ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x40);
    Js::ScriptContextProfiler::ScriptContextProfiler(this_00);
    this_00->pageAllocator = pageAllocator;
    this_00->next = this->backgroundCodeGenProfiler;
    this->backgroundCodeGenProfiler = this_00;
  }
  return;
}

Assistant:

void NativeCodeGenerator::AllocateBackgroundCodeGenProfiler(PageAllocator *pageAllocator)
{
#ifdef PROFILE_EXEC
if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
{
    Js::ScriptContextProfiler *codegenProfiler = NoCheckHeapNew(Js::ScriptContextProfiler);
    codegenProfiler->pageAllocator = pageAllocator;
    codegenProfiler->next = this->backgroundCodeGenProfiler;
    this->backgroundCodeGenProfiler = codegenProfiler;
}
#endif
}